

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O3

void __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
::Video(Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
        *this,VideoBusHandler *bus_handler)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(Cycles),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/AppleII/Video.hpp:122:22)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(Cycles),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/AppleII/Video.hpp:122:22)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  VideoBase::VideoBase(&this->super_VideoBase,false,(function<void_(Cycles)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  this->bus_handler_ = bus_handler;
  return;
}

Assistant:

Video(BusHandler &bus_handler) :
			VideoBase(is_iie, [this] (Cycles cycles) { advance(cycles); }),
			bus_handler_(bus_handler) {}